

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nscookiejar_iterate(lws_cache_nscookiejar_t *cache,int fd,nsc_cb_t cb,void *opaque)

{
  bool bVar1;
  int iVar2;
  __off_t _Var3;
  ulong uVar4;
  long lVar5;
  ssize_t sVar6;
  uint uVar7;
  bool local_171;
  int n1;
  char eof;
  char temp [256];
  int ret;
  int ignore;
  int r;
  int e;
  int n;
  int m;
  void *opaque_local;
  nsc_cb_t cb_local;
  int fd_local;
  lws_cache_nscookiejar_t *cache_local;
  
  e = 0;
  r = 0;
  ret = 1;
  temp[0xfc] = '\0';
  temp[0xfd] = '\0';
  temp[0xfe] = '\0';
  temp[0xff] = '\0';
  temp[0xf8] = '\0';
  temp[0xf9] = '\0';
  temp[0xfa] = '\0';
  temp[0xfb] = '\0';
  bVar1 = false;
  _Var3 = lseek(fd,0,0);
  if (_Var3 == -1) {
    cache_local._4_4_ = -1;
  }
  else {
    do {
      _lws_log(0x10,"%s: n %d, m %d\n","nscookiejar_iterate",(ulong)(uint)r,(ulong)(uint)e);
      uVar4 = read(fd,(void *)((long)&n1 + (long)e),0x100 - (long)e);
      _lws_log(0x10,"%s: n1 %d\n","nscookiejar_iterate",uVar4 & 0xffffffff);
      if ((int)uVar4 < 1) {
        bVar1 = true;
        if (e != r) goto LAB_001147bc;
      }
      else {
        r = (int)uVar4 + r;
LAB_001147bc:
        while (e < r) {
          iVar2 = e + 1;
          lVar5 = (long)e;
          e = iVar2;
          if (*(char *)((long)&n1 + lVar5) == '\n') {
            if ((char)n1 == '#') {
              ignore = 0;
            }
            else {
              ignore = (*cb)(cache,opaque,ret | 2,(char *)&n1,(long)iVar2 - 1);
            }
            ret = 1;
            temp[0xfc] = '\0';
            temp[0xfd] = '\0';
            temp[0xfe] = '\0';
            temp[0xff] = '\0';
            memmove(&n1,(void *)((long)&n1 + (long)iVar2),(long)(r - iVar2));
            iVar2 = r - iVar2;
            e = 0;
            sVar6 = read(fd,(void *)((long)&n1 + (long)iVar2),0x100 - (long)iVar2);
            r = (int)sVar6 + iVar2;
            if (ignore != 0) {
              temp[0xf8] = (undefined1)ignore;
              temp[0xf9] = ignore._1_1_;
              temp[0xfa] = ignore._2_1_;
              temp[0xfb] = ignore._3_1_;
              goto LAB_001149d6;
            }
          }
        }
        if (e != 0) {
          if ((temp._252_4_ == 0) && (((ret != 1 || (r == 0)) || ((char)n1 != '#')))) {
            uVar7 = 0;
            if (r == e && bVar1) {
              uVar7 = 2;
            }
            ignore = (*cb)(cache,opaque,ret | uVar7,(char *)&n1,(long)e);
            e = 0;
            r = 0;
          }
          else {
            ignore = 0;
            temp[0xfc] = '\x01';
            temp[0xfd] = '\0';
            temp[0xfe] = '\0';
            temp[0xff] = '\0';
          }
          if (ignore != 0) {
            temp[0xf8] = (undefined1)ignore;
            temp[0xf9] = ignore._1_1_;
            temp[0xfa] = ignore._2_1_;
            temp[0xfb] = ignore._3_1_;
            goto LAB_001149d6;
          }
          ret = 0;
        }
      }
      local_171 = !bVar1 || r != e;
    } while (local_171);
    temp[0xf8] = '\0';
    temp[0xf9] = '\0';
    temp[0xfa] = '\0';
    temp[0xfb] = '\0';
LAB_001149d6:
    cache_local._4_1_ = temp[0xf8];
    cache_local._5_1_ = temp[0xf9];
    cache_local._6_1_ = temp[0xfa];
    cache_local._7_1_ = temp[0xfb];
  }
  return cache_local._4_4_;
}

Assistant:

static int
nscookiejar_iterate(lws_cache_nscookiejar_t *cache, int fd,
		    nsc_cb_t cb, void *opaque)
{
	int m = 0, n = 0, e, r = LCN_SOL, ignore = 0, ret = 0;
	char temp[256], eof = 0;

	if (lseek(fd, 0, SEEK_SET) == (off_t)-1)
		return -1;

	do { /* for as many buffers in the file */

		int n1;

		lwsl_debug("%s: n %d, m %d\n", __func__, n, m);

		n1 = (int)read(fd, temp + m, sizeof(temp) - (size_t)m);

		lwsl_debug("%s: n1 %d\n", __func__, n1);

		if (n1 <= 0) {
			eof = 1;
			if (m == n)
				continue;
		} else
			n += n1;

		while (m < n) {

			m++;

			if (temp[m - 1] != '\n')
				continue;

			/* ie, we hit EOL */

			if (temp[0] == '#')
				/* lines starting with # are comments */
				e = 0;
			else
				e = cb(cache, opaque, r | LCN_EOL, temp,
				       (size_t)m - 1);
			r = LCN_SOL;
			ignore = 0;
			/*
			 * Move back remainder and prefill the gap that opened
			 * up: we want to pass enough in the start chunk so the
			 * cb can classify it even if it can't get all the
			 * value part in one go
			 */
			memmove(temp, temp + m, (size_t)(n - m));
			n -= m;
			m = 0;

			n1 = (int)read(fd, temp + n, sizeof(temp) - (size_t)n);
			n += n1;

			if (e) {
				ret = e;
				goto bail;
			}
		}

		if (m) {
			/* we ran out of buffer */
			if (ignore || (r == LCN_SOL && n && temp[0] == '#')) {
				e = 0;
				ignore = 1;
			} else {
				e = cb(cache, opaque,
				       r | (n == m && eof ? LCN_EOL : 0),
				       temp, (size_t)m);

				m = 0;
				n = 0;
			}

			if (e) {
				/*
				 * We have to call off the whole thing if any
				 * step, eg, OOMs
				 */
				ret = e;
				goto bail;
			}
			r = 0;
		}

	} while (!eof || n != m);

	ret = 0;

bail:

	return ret;
}